

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_EqualLogicalConstant_Test::TestBody(ExprTest_EqualLogicalConstant_Test *this)

{
  ExprFactory *this_00;
  Expr EVar1;
  bool bVar2;
  LogicalConstant LVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  
  EVar1.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  this_00 = &(this->super_ExprTest).factory_;
  LVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,false);
  local_48[0] = (internal)
                mp::Equal(EVar1,(Expr)LVar3.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                                      super_ExprBase.impl_);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,
               (AssertionResult *)"Equal(l0, factory_.MakeLogicalConstant(false))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x358
               ,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  EVar1.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  LVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  bVar2 = mp::Equal(EVar1,(Expr)LVar3.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                                super_ExprBase.impl_);
  local_48[0] = (internal)!bVar2;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,(AssertionResult *)"Equal(l0, factory_.MakeLogicalConstant(true))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x359
               ,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalConstant) {
  EXPECT_TRUE(Equal(l0, factory_.MakeLogicalConstant(false)));
  EXPECT_FALSE(Equal(l0, factory_.MakeLogicalConstant(true)));
}